

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdBot.cpp
# Opt level: O3

void saveData(void)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  ofstream ignoredUsersFile;
  long local_220;
  filebuf local_218 [240];
  ios_base local_128 [264];
  
  std::ofstream::ofstream(&local_220,"data/ignored_users.txt",_S_out);
  if ((_Rb_tree_header *)
      ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    p_Var2 = ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&local_220,*(char **)(p_Var2 + 1),(long)p_Var2[1]._M_parent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 !=
             &ignoredUsers_abi_cxx11_._M_t._M_impl.super__Rb_tree_header);
  }
  local_220 = _VTT;
  *(undefined8 *)(local_218 + *(long *)(_VTT + -0x18) + -8) = _operator_delete__;
  std::filebuf::~filebuf(local_218);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void saveData() {
    std::ofstream ignoredUsersFile("data/ignored_users.txt");
    for (const std::string& ignoredUser : ignoredUsers) {
        ignoredUsersFile << ignoredUser << "\n";
    }
}